

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_unittests.cc
# Opt level: O0

void __thiscall Simple_All_Test::TestBody(Simple_All_Test *this)

{
  bool bVar1;
  uint uVar2;
  data_type *pdVar3;
  pointer ppVar4;
  int iVar5;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i_1;
  int i;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  dmap;
  dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  dset;
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  smap;
  sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  sset;
  const_iterator *in_stack_fffffffffffff988;
  undefined7 in_stack_fffffffffffff990;
  undefined1 in_stack_fffffffffffff997;
  pointer in_stack_fffffffffffff998;
  undefined6 in_stack_fffffffffffff9a0;
  undefined1 in_stack_fffffffffffff9a6;
  undefined1 in_stack_fffffffffffff9a7;
  char *in_stack_fffffffffffff9a8;
  undefined6 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b6;
  undefined1 in_stack_fffffffffffff9b7;
  value_type *in_stack_fffffffffffff9b8;
  undefined6 in_stack_fffffffffffff9c0;
  undefined1 in_stack_fffffffffffff9c6;
  undefined1 in_stack_fffffffffffff9c7;
  bool local_61a;
  value_type *in_stack_fffffffffffff9e8;
  undefined6 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f6;
  undefined1 in_stack_fffffffffffff9f7;
  Message *in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa10;
  int in_stack_fffffffffffffa14;
  iterator local_5a8;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_590;
  undefined1 local_571;
  AssertionResult local_570 [2];
  undefined1 local_549;
  iterator local_548;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_530;
  undefined1 local_511;
  AssertionResult local_510 [2];
  undefined1 local_4e9;
  const_iterator local_4e8;
  dense_hashtable_const_iterator<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  local_4d0;
  undefined1 local_4b1;
  AssertionResult local_4b0 [2];
  undefined1 local_489;
  bool local_3a9;
  AssertionResult local_3a8 [2];
  undefined1 local_381;
  undefined1 local_2e9;
  AssertionResult local_2e8;
  uint local_2d4;
  undefined1 local_2b9;
  undefined1 local_221;
  AssertionResult local_220;
  int local_210;
  int local_20c;
  int local_1e4;
  int local_190;
  undefined4 local_18c;
  undefined4 local_188;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> local_183 [88];
  libc_allocator_with_realloc<int> local_12b [88];
  libc_allocator_with_realloc<std::pair<const_int,_int>_> local_d3 [112];
  libc_allocator_with_realloc<int> local_63 [99];
  
  google::libc_allocator_with_realloc<int>::libc_allocator_with_realloc(local_63);
  google::
  sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  ::sparse_hash_set((sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                     *)CONCAT17(in_stack_fffffffffffff9b7,
                                CONCAT16(in_stack_fffffffffffff9b6,in_stack_fffffffffffff9b0)),
                    (size_type)in_stack_fffffffffffff9a8,
                    (hasher *)
                    CONCAT17(in_stack_fffffffffffff9a7,
                             CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)),
                    (key_equal *)in_stack_fffffffffffff998,
                    (allocator_type *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990))
  ;
  google::libc_allocator_with_realloc<int>::~libc_allocator_with_realloc(local_63);
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::libc_allocator_with_realloc
            (local_d3);
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::sparse_hash_map((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)CONCAT17(in_stack_fffffffffffff9b7,
                                CONCAT16(in_stack_fffffffffffff9b6,in_stack_fffffffffffff9b0)),
                    (size_type)in_stack_fffffffffffff9a8,
                    (hasher *)
                    CONCAT17(in_stack_fffffffffffff9a7,
                             CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)),
                    (key_equal *)in_stack_fffffffffffff998,
                    (allocator_type *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990))
  ;
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::~libc_allocator_with_realloc
            (local_d3);
  google::libc_allocator_with_realloc<int>::libc_allocator_with_realloc(local_12b);
  google::
  dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  ::dense_hash_set((dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                    *)CONCAT17(in_stack_fffffffffffff9b7,
                               CONCAT16(in_stack_fffffffffffff9b6,in_stack_fffffffffffff9b0)),
                   (size_type)in_stack_fffffffffffff9a8,
                   (hasher *)
                   CONCAT17(in_stack_fffffffffffff9a7,
                            CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)),
                   (key_equal *)in_stack_fffffffffffff998,
                   (allocator_type *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
  google::libc_allocator_with_realloc<int>::~libc_allocator_with_realloc(local_12b);
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::libc_allocator_with_realloc
            (local_183);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::dense_hash_map((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                    *)CONCAT17(in_stack_fffffffffffff9b7,
                               CONCAT16(in_stack_fffffffffffff9b6,in_stack_fffffffffffff9b0)),
                   (size_type)in_stack_fffffffffffff9a8,
                   (hasher *)
                   CONCAT17(in_stack_fffffffffffff9a7,
                            CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)),
                   (key_equal *)in_stack_fffffffffffff998,
                   (allocator_type *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::~libc_allocator_with_realloc
            (local_183);
  local_188 = 0xffffffff;
  google::
  dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  ::set_empty_key((dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                   *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                  (key_type *)in_stack_fffffffffffff988);
  local_18c = 0xffffffff;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::set_empty_key((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                  (key_type *)in_stack_fffffffffffff988);
  for (local_190 = 0; local_190 < 100; local_190 = local_190 + 10) {
    google::
    sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::insert((sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
              *)CONCAT17(in_stack_fffffffffffff9f7,
                         CONCAT16(in_stack_fffffffffffff9f6,in_stack_fffffffffffff9f0)),
             in_stack_fffffffffffff9e8);
    in_stack_fffffffffffffa14 = local_190 + 1;
    pdVar3 = google::
             sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             ::operator[]((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                           *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                          (key_type *)in_stack_fffffffffffff988);
    *pdVar3 = in_stack_fffffffffffffa14;
    local_1e4 = local_190 + 5;
    google::
    dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::insert((dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
              *)CONCAT17(in_stack_fffffffffffff9c7,
                         CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)),
             in_stack_fffffffffffff9b8);
    iVar5 = local_190 + 6;
    local_20c = local_190 + 5;
    in_stack_fffffffffffffa08 =
         (Message *)
         google::
         dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         ::operator[]((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                       *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                      (key_type *)in_stack_fffffffffffff988);
    *(int *)&(in_stack_fffffffffffffa08->ss_)._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl = iVar5;
  }
  for (local_210 = 0; local_210 < 100; local_210 = local_210 + 1) {
    google::
    sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::find((sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
            *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
           (key_type *)in_stack_fffffffffffff988);
    google::
    sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::end((sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
           *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    local_221 = google::
                sparse_hashtable_const_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                ::operator!=((sparse_hashtable_const_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                              *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                             in_stack_fffffffffffff988);
    uVar2 = local_210 * -0x33333333 + 0x19999998;
    local_2b9 = (uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f) < 0x19999999;
    testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
              (in_stack_fffffffffffff9a8,
               (char *)CONCAT17(in_stack_fffffffffffff9a7,
                                CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)),
               (bool *)in_stack_fffffffffffff998,
               (bool *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)
                 CONCAT17(in_stack_fffffffffffff9c7,
                          CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)));
      testing::AssertionResult::failure_message((AssertionResult *)0x9d0d12);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 CONCAT17(in_stack_fffffffffffff9c7,
                          CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)),
                 (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff9b7,
                                  CONCAT16(in_stack_fffffffffffff9b6,in_stack_fffffffffffff9b0)),
                 (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff9a7,
                                  CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 in_stack_fffffffffffffa08);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
      testing::Message::~Message((Message *)0x9d0d6f);
    }
    local_2d4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x9d0ddd);
    if (local_2d4 != 0) goto LAB_009d18bd;
    google::
    sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
           (key_type *)in_stack_fffffffffffff988);
    google::
    sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::end((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    local_2e9 = google::
                sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                ::operator!=((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                              *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                             (iterator *)in_stack_fffffffffffff988);
    uVar2 = local_210 * -0x33333333 + 0x19999998;
    local_381 = (uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f) < 0x19999999;
    testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
              (in_stack_fffffffffffff9a8,
               (char *)CONCAT17(in_stack_fffffffffffff9a7,
                                CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)),
               (bool *)in_stack_fffffffffffff998,
               (bool *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e8);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)
                 CONCAT17(in_stack_fffffffffffff9c7,
                          CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)));
      testing::AssertionResult::failure_message((AssertionResult *)0x9d0f03);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 CONCAT17(in_stack_fffffffffffff9c7,
                          CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)),
                 (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff9b7,
                                  CONCAT16(in_stack_fffffffffffff9b6,in_stack_fffffffffffff9b0)),
                 (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff9a7,
                                  CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 in_stack_fffffffffffffa08);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
      testing::Message::~Message((Message *)0x9d0f60);
    }
    local_2d4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x9d0fce);
    if (local_2d4 != 0) goto LAB_009d18bd;
    google::
    sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
           (key_type *)in_stack_fffffffffffff988);
    google::
    sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::end((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    bVar1 = google::
            sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            ::operator!=((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                          *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                         (iterator *)in_stack_fffffffffffff988);
    local_61a = false;
    if (bVar1) {
      google::
      sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::find((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
              *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
             (key_type *)in_stack_fffffffffffff988);
      ppVar4 = google::
               sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
               ::operator->((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                             *)0x9d106d);
      local_61a = ppVar4->second == local_210 + 1;
    }
    local_3a9 = local_61a;
    uVar2 = local_210 * -0x33333333 + 0x19999998;
    local_489 = (uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f) < 0x19999999;
    testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
              (in_stack_fffffffffffff9a8,
               (char *)CONCAT17(in_stack_fffffffffffff9a7,
                                CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)),
               (bool *)in_stack_fffffffffffff998,
               (bool *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3a8);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)
                 CONCAT17(in_stack_fffffffffffff9c7,
                          CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)));
      testing::AssertionResult::failure_message((AssertionResult *)0x9d1153);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 CONCAT17(in_stack_fffffffffffff9c7,
                          CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)),
                 (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff9b7,
                                  CONCAT16(in_stack_fffffffffffff9b6,in_stack_fffffffffffff9b0)),
                 (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff9a7,
                                  CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 in_stack_fffffffffffffa08);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
      testing::Message::~Message((Message *)0x9d11b0);
    }
    local_2d4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x9d121e);
    if (local_2d4 != 0) goto LAB_009d18bd;
    google::
    dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::find((dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
            *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
           (key_type *)in_stack_fffffffffffff988);
    google::
    dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::end((dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
           *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    in_stack_fffffffffffff9c7 =
         google::
         dense_hashtable_const_iterator<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
         ::operator!=(&local_4d0,&local_4e8);
    local_4e9 = local_210 % 10 == 5;
    local_4b1 = in_stack_fffffffffffff9c7;
    testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
              (in_stack_fffffffffffff9a8,
               (char *)CONCAT17(in_stack_fffffffffffff9a7,
                                CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)),
               (bool *)in_stack_fffffffffffff998,
               (bool *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b0);
    in_stack_fffffffffffff9c6 = bVar1;
    if (!bVar1) {
      testing::Message::Message
                ((Message *)
                 CONCAT17(in_stack_fffffffffffff9c7,CONCAT16(bVar1,in_stack_fffffffffffff9c0)));
      in_stack_fffffffffffff9b8 =
           (value_type *)testing::AssertionResult::failure_message((AssertionResult *)0x9d1355);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 CONCAT17(in_stack_fffffffffffff9c7,
                          CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)),
                 (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff9b7,
                                  CONCAT16(in_stack_fffffffffffff9b6,in_stack_fffffffffffff9b0)),
                 (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff9a7,
                                  CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 in_stack_fffffffffffffa08);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
      testing::Message::~Message((Message *)0x9d13b2);
    }
    local_2d4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x9d1420);
    if (local_2d4 != 0) goto LAB_009d18bd;
    google::
    dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
           (key_type *)in_stack_fffffffffffff988);
    google::
    dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::end((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    in_stack_fffffffffffff9b7 =
         google::
         dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         ::operator!=(&local_530,&local_548);
    local_549 = local_210 % 10 == 5;
    local_511 = in_stack_fffffffffffff9b7;
    testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
              (in_stack_fffffffffffff9a8,
               (char *)CONCAT17(in_stack_fffffffffffff9a7,
                                CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)),
               (bool *)in_stack_fffffffffffff998,
               (bool *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_510);
    in_stack_fffffffffffff9b6 = bVar1;
    if (!bVar1) {
      testing::Message::Message
                ((Message *)
                 CONCAT17(in_stack_fffffffffffff9c7,
                          CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)));
      in_stack_fffffffffffff9a8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x9d1557);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 CONCAT17(in_stack_fffffffffffff9c7,
                          CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)),
                 (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff9b7,
                                  CONCAT16(in_stack_fffffffffffff9b6,in_stack_fffffffffffff9b0)),
                 (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff9a7,
                                  CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 in_stack_fffffffffffffa08);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
      testing::Message::~Message((Message *)0x9d15b4);
    }
    local_2d4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x9d1622);
    if (local_2d4 != 0) goto LAB_009d18bd;
    google::
    dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
           (key_type *)in_stack_fffffffffffff988);
    google::
    dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::end((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    in_stack_fffffffffffff9a7 =
         google::
         dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         ::operator!=(&local_590,&local_5a8);
    in_stack_fffffffffffff9a6 = false;
    if ((bool)in_stack_fffffffffffff9a7) {
      google::
      dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::find((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
              *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
             (key_type *)in_stack_fffffffffffff988);
      in_stack_fffffffffffff998 =
           google::
           dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           ::operator->((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)0x9d16c1);
      in_stack_fffffffffffff9a6 = in_stack_fffffffffffff998->second == local_210 + 1;
    }
    local_571 = in_stack_fffffffffffff9a6;
    testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
              (in_stack_fffffffffffff9a8,
               (char *)CONCAT17(in_stack_fffffffffffff9a7,
                                CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)),
               (bool *)in_stack_fffffffffffff998,
               (bool *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_570);
    in_stack_fffffffffffff997 = bVar1;
    if (!bVar1) {
      testing::Message::Message
                ((Message *)
                 CONCAT17(in_stack_fffffffffffff9c7,
                          CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)));
      in_stack_fffffffffffff988 =
           (const_iterator *)testing::AssertionResult::failure_message((AssertionResult *)0x9d17b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 CONCAT17(in_stack_fffffffffffff9c7,
                          CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)),
                 (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff9b7,
                                  CONCAT16(in_stack_fffffffffffff9b6,in_stack_fffffffffffff9b0)),
                 (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff9a7,
                                  CONCAT16(in_stack_fffffffffffff9a6,in_stack_fffffffffffff9a0)));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 in_stack_fffffffffffffa08);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
      testing::Message::~Message((Message *)0x9d1813);
    }
    local_2d4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x9d187e);
    if (local_2d4 != 0) goto LAB_009d18bd;
  }
  local_2d4 = 0;
LAB_009d18bd:
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::~dense_hash_map((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)0x9d18ca);
  google::
  dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  ::~dense_hash_set((dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                     *)0x9d18d7);
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::~sparse_hash_map((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                      *)0x9d18e4);
  google::
  sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  ::~sparse_hash_set((sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                      *)0x9d18f1);
  return;
}

Assistant:

TEST(Simple, All) {
  google::sparse_hash_set<int> sset;
  google::sparse_hash_map<int, int> smap;
  google::dense_hash_set<int> dset;
  google::dense_hash_map<int, int> dmap;
  dset.set_empty_key(-1);
  dmap.set_empty_key(-1);

  for (int i = 0; i < 100; i += 10) {  // go by tens
    sset.insert(i);
    smap[i] = i + 1;
    dset.insert(i + 5);
    dmap[i + 5] = i + 6;
  }

  for (int i = 0; i < 100; i++) {
    ASSERT_EQ(sset.find(i) != sset.end(), (i % 10) == 0);
    ASSERT_EQ(smap.find(i) != smap.end(), (i % 10) == 0);
    ASSERT_EQ(smap.find(i) != smap.end() && smap.find(i)->second == i + 1,
              (i % 10) == 0);
    ASSERT_EQ(dset.find(i) != dset.end(), (i % 10) == 5);
    ASSERT_EQ(dmap.find(i) != dmap.end(), (i % 10) == 5);
    ASSERT_EQ(dmap.find(i) != dmap.end() && dmap.find(i)->second == i + 1,
              (i % 10) == 5);
  }
}